

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::MultiNodeChain<QByteArray>::free(MultiNodeChain<QByteArray> *this,void *__ptr)

{
  Data *pDVar1;
  MultiNodeChain<QByteArray> *pMVar2;
  qsizetype nEntries;
  
  do {
    pDVar1 = (this->value).d.d;
    pMVar2 = this->next;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((this->value).d.d)->super_QArrayData,1,0x10);
      }
    }
    operator_delete(this,0x20);
    this = pMVar2;
  } while (pMVar2 != (MultiNodeChain<QByteArray> *)0x0);
  return;
}

Assistant:

qsizetype free() noexcept(std::is_nothrow_destructible_v<T>)
    {
        qsizetype nEntries = 0;
        MultiNodeChain *e = this;
        while (e) {
            MultiNodeChain *n = e->next;
            ++nEntries;
            delete e;
            e = n;
        }
        return  nEntries;
    }